

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# serialize-test.c++
# Opt level: O3

void __thiscall capnp::_::anon_unknown_0::TestCase475::run(TestCase475 *this)

{
  TestInputStream input;
  AlignedData<4> data;
  Maybe<kj::Exception> e;
  BufferedInputStream local_1d8;
  undefined8 *local_1d0;
  undefined1 *local_1c8;
  undefined1 local_1c0;
  undefined8 local_1b8;
  undefined8 uStack_1b0;
  undefined8 local_1a8;
  undefined8 uStack_1a0;
  undefined1 local_198 [8];
  undefined8 local_190;
  undefined4 local_188;
  Runnable local_180;
  undefined1 *local_178;
  undefined8 *local_170;
  Maybe<kj::Exception> local_168;
  
  local_178 = (undefined1 *)&local_1d8;
  local_1d0 = &local_1b8;
  local_1a8 = 0;
  uStack_1a0 = 0;
  local_1b8 = 0x300000000;
  uStack_1b0 = 0x200000000;
  local_1d8.super_InputStream._vptr_InputStream = (InputStream)&PTR__BufferedInputStream_0036d6a0;
  local_1c8 = local_198;
  local_1c0 = 0;
  local_170 = &local_190;
  local_188 = 0x40;
  local_190 = 2;
  local_180._vptr_Runnable = (_func_int **)&PTR_run_0036d9d0;
  kj::_::runCatchingExceptions(&local_168,&local_180);
  if ((local_168.ptr.isSet == false) && (kj::_::Debug::minSeverity < 3)) {
    kj::_::Debug::log<char_const(&)[30],char_const(&)[33]>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/serialize-test.c++"
               ,0x1ec,ERROR,
               "\"failed: expected \" \"e != nullptr\", \"Should have thrown an exception.\"",
               (char (*) [30])"failed: expected e != nullptr",
               (char (*) [33])"Should have thrown an exception.");
  }
  if ((local_168.ptr.isSet & 1U) != 0) {
    kj::Exception::~Exception(&local_168.ptr.field_1.value);
  }
  kj::BufferedInputStream::~BufferedInputStream(&local_1d8);
  return;
}

Assistant:

TEST(Serialize, RejectHugeMessage) {
  // A message whose root struct contains two words of data!
  AlignedData<4> data = {{0,0,0,0,3,0,0,0, 0,0,0,0,2,0,0,0, 0,0,0,0,0,0,0,0, 0,0,0,0,0,0,0,0}};

  TestInputStream input(kj::arrayPtr(data.words, 4), false);

  // We'll set the traversal limit to 2 words so our 3-word message is too big.
  ReaderOptions options;
  options.traversalLimitInWords = 2;

  kj::Maybe<kj::Exception> e = kj::runCatchingExceptions([&]() {
    InputStreamMessageReader reader(input, options);
#if !KJ_NO_EXCEPTIONS
    ADD_FAILURE() << "Should have thrown an exception.";
#endif
  });

  KJ_EXPECT(e != nullptr, "Should have thrown an exception.");
}